

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O0

void __thiscall ftxui::TerminalInputParser::Send(TerminalInputParser *this,Output output)

{
  anon_union_20_2_6ed4b992_for_Output_1 mouse;
  pointer pSVar1;
  string local_1b8;
  Event local_198;
  CursorReporting local_158;
  undefined8 uStack_150;
  int local_148;
  string local_140;
  Event local_120;
  string local_e0;
  Event local_c0;
  string local_70;
  Event local_50;
  TerminalInputParser *local_10;
  TerminalInputParser *this_local;
  
  mouse = output.field_1;
  local_10 = this;
  switch(output.type) {
  case UNCOMPLETED:
    break;
  case DROP:
    std::__cxx11::string::clear();
    break;
  case CHARACTER:
    pSVar1 = std::
             unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
             ::operator->(&this->out_);
    std::__cxx11::string::string((string *)&local_70,(string *)&this->pending_);
    Event::Character(&local_50,&local_70);
    SenderImpl<ftxui::Event>::Send(pSVar1,&local_50);
    Event::~Event(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::clear();
    break;
  case SPECIAL:
    pSVar1 = std::
             unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
             ::operator->(&this->out_);
    std::__cxx11::string::string((string *)&local_e0,(string *)&this->pending_);
    Event::Special(&local_c0,&local_e0);
    SenderImpl<ftxui::Event>::Send(pSVar1,&local_c0);
    Event::~Event(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::clear();
    break;
  case MOUSE:
    pSVar1 = std::
             unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
             ::operator->(&this->out_);
    std::__cxx11::string::string((string *)&local_140,(string *)&this->pending_);
    local_148 = output.field_1.mouse.y;
    local_158 = output.field_1.cursor;
    uStack_150 = output.field_1._8_8_;
    Event::Mouse(&local_120,&local_140,mouse.mouse);
    SenderImpl<ftxui::Event>::Send(pSVar1,&local_120);
    Event::~Event(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::clear();
    break;
  case CURSOR_REPORTING:
    pSVar1 = std::
             unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
             ::operator->(&this->out_);
    std::__cxx11::string::string((string *)&local_1b8,(string *)&this->pending_);
    Event::CursorReporting(&local_198,&local_1b8,output.field_1.cursor.x,output.field_1.cursor.y);
    SenderImpl<ftxui::Event>::Send(pSVar1,&local_198);
    Event::~Event(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void TerminalInputParser::Send(TerminalInputParser::Output output) {
  switch (output.type) {
    case UNCOMPLETED:
      return;

    case DROP:
      pending_.clear();
      return;

    case CHARACTER:
      out_->Send(Event::Character(std::move(pending_)));
      pending_.clear();
      return;

    case SPECIAL:
      out_->Send(Event::Special(std::move(pending_)));
      pending_.clear();
      return;

    case MOUSE:
      out_->Send(Event::Mouse(std::move(pending_), output.mouse));
      pending_.clear();
      return;

    case CURSOR_REPORTING:
      out_->Send(Event::CursorReporting(std::move(pending_), output.cursor.x,
                                        output.cursor.y));
      pending_.clear();
      return;
  }
  // NOT_REACHED().
}